

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O0

void __thiscall
pele::physics::reactions::ReactorArkode::print_final_stats(ReactorArkode *this,void *arkode_mem)

{
  Print *pPVar1;
  Print *os_;
  long in_RDI;
  int flag;
  long nfi;
  long nfe;
  long netf;
  long nst_a;
  long nst;
  char (*in_stack_fffffffffffff798) [23];
  Print *in_stack_fffffffffffff7a0;
  long *in_stack_fffffffffffff7a8;
  long *in_stack_fffffffffffff7b0;
  void *in_stack_fffffffffffff7b8;
  ostream *in_stack_fffffffffffff7c8;
  Print *in_stack_fffffffffffff7d0;
  Print *in_stack_fffffffffffff810;
  
  if (*(int *)(in_RDI + 0x70) == 0) {
    ARKStepGetNumSteps(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ARKStepGetNumStepAttempts(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ARKStepGetNumErrTestFails(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ARKStepGetNumRhsEvals
              (in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
  }
  else {
    ERKStepGetNumSteps(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ERKStepGetNumStepAttempts(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ERKStepGetNumErrTestFails(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    ERKStepGetNumRhsEvals(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    utils::check_flag(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                      (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
  }
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [20])in_stack_fffffffffffff798);
  amrex::Print::~Print(in_stack_fffffffffffff810);
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [2])in_stack_fffffffffffff798);
  amrex::Print::~Print(in_stack_fffffffffffff810);
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  pPVar1 = amrex::Print::operator<<(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [2])in_stack_fffffffffffff798);
  amrex::Print::~Print(in_stack_fffffffffffff810);
  amrex::OutStream();
  amrex::Print::Print(pPVar1,in_stack_fffffffffffff7c8);
  os_ = amrex::Print::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [2])in_stack_fffffffffffff798);
  amrex::Print::~Print(in_stack_fffffffffffff810);
  amrex::OutStream();
  amrex::Print::Print(pPVar1,(ostream *)os_);
  amrex::Print::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  pPVar1 = amrex::Print::operator<<(in_stack_fffffffffffff7a0,(long *)in_stack_fffffffffffff798);
  amrex::Print::operator<<(pPVar1,(char (*) [2])in_stack_fffffffffffff798);
  amrex::Print::~Print(in_stack_fffffffffffff810);
  return;
}

Assistant:

void
ReactorArkode::print_final_stats(void* arkode_mem)
{
  long int nst, nst_a, netf, nfe, nfi;
  int flag;

  if (use_erkstep != 0) {
    flag = ERKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ERKStepGetNumSteps", 1);
    flag = ERKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ERKStepGetNumStepAttempts", 1);
    flag = ERKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ERKStepGetNumErrTestFails", 1);
    flag = ERKStepGetNumRhsEvals(arkode_mem, &nfe);
    utils::check_flag(&flag, "ERKStepGetNumRhsEvals", 1);

  } else {
    flag = ARKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ARKStepGetNumSteps", 1);
    flag = ARKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ARKStepGetNumStepAttempts", 1);
    flag = ARKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ARKStepGetNumErrTestFails", 1);
    flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
    utils::check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  }

#ifdef AMREX_USE_OMP
  amrex::Print() << "\nFinal Statistics: "
                 << "(thread:" << omp_get_thread_num() << ", ";
  amrex::Print() << "arkodeMem:" << arkode_mem << ")\n";
#else
  amrex::Print() << "\nFinal Statistics:\n";
#endif

  amrex::Print() << "   Internal steps   = " << nst << "\n";
  amrex::Print() << "   Attempted steps  = " << nst_a << "\n";
  amrex::Print() << "   Error test fails = " << netf << "\n";
  amrex::Print() << "   Total RHS evals  = " << nfe << "\n";
}